

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  bool bVar1;
  int iVar2;
  CRef CVar3;
  vec<unsigned_int,_int> *ts;
  int *piVar4;
  Lit *pLVar5;
  bool local_5a;
  bool local_59;
  int local_34;
  int local_30;
  int local_2c;
  Clause *local_28;
  Clause *c;
  SimpSolver *pSStack_18;
  CRef cr_local;
  SimpSolver *this_local;
  Lit l_local;
  
  c._4_4_ = cr;
  pSStack_18 = this;
  this_local._4_4_ = l.x;
  local_28 = ClauseAllocator::operator[](&(this->super_Solver).ca,cr);
  iVar2 = Solver::decisionLevel(&this->super_Solver);
  if (iVar2 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0xce,"bool Minisat::SimpSolver::strengthenClause(CRef, Lit)");
  }
  if ((this->use_simplification & 1U) == 0) {
    __assert_fail("use_simplification",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0xcf,"bool Minisat::SimpSolver::strengthenClause(CRef, Lit)");
  }
  Queue<unsigned_int>::insert(&this->subsumption_queue,c._4_4_);
  iVar2 = Clause::size(local_28);
  if (iVar2 == 2) {
    removeClause(this,c._4_4_);
    local_2c = this_local._4_4_;
    Clause::strengthen(local_28,this_local._4_4_);
  }
  else {
    Solver::detachClause(&this->super_Solver,c._4_4_,true);
    local_30 = this_local._4_4_;
    Clause::strengthen(local_28,this_local._4_4_);
    Solver::attachClause(&this->super_Solver,c._4_4_);
    local_34 = var(this_local._4_4_);
    ts = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
         ::operator[](&this->occurs,&local_34);
    remove<Minisat::vec<unsigned_int,int>,unsigned_int>(ts,(uint *)((long)&c + 4));
    piVar4 = IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::operator[]
                       (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,
                        this_local._4_4_);
    *piVar4 = *piVar4 + -1;
    iVar2 = var(this_local._4_4_);
    updateElimHeap(this,iVar2);
  }
  iVar2 = Clause::size(local_28);
  if (iVar2 == 1) {
    pLVar5 = Clause::operator[](local_28,0);
    bVar1 = Solver::enqueue(&this->super_Solver,(Lit)pLVar5->x,0xffffffff);
    local_59 = false;
    if (bVar1) {
      CVar3 = Solver::propagate(&this->super_Solver);
      local_59 = CVar3 == 0xffffffff;
    }
    local_5a = local_59;
  }
  else {
    local_5a = true;
  }
  return local_5a;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[l]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}